

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void int_list_intersect(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
code_r0x0014a78c:
  if (-1 < *b) {
    iVar2 = *c;
    while (-1 < iVar2) {
      while( true ) {
        piVar3 = b + 1;
        iVar1 = *b;
        if (iVar1 == iVar2) {
          *a = iVar1;
          a = a + 1;
          c = c + 1;
          b = piVar3;
          goto code_r0x0014a78c;
        }
        if (iVar2 <= iVar1) break;
        b = piVar3;
        if (*piVar3 < 0) goto LAB_0014a7c8;
      }
      piVar3 = c + 1;
      c = c + 1;
      iVar2 = *piVar3;
    }
  }
LAB_0014a7c8:
  *a = -1;
  return;
}

Assistant:

void int_list_intersect(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) break;
  Lagainb:
    if (*b == *c) {
      *a++ = *b++;
      c++;
      continue;
    }
    if (*b < *c) {
      b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}